

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::log<int,char[7]>(ConsoleLogger *this,int *args,char (*args_1) [7])

{
  char (*args_local_1) [7];
  int *args_local;
  ConsoleLogger *this_local;
  
  if (this->loglevel < 1) {
    std::mutex::lock(&this->mtx);
    std::operator<<(this->out,"    ");
    print<int,char[7]>(this,args,args_1);
    std::mutex::unlock(&this->mtx);
  }
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}